

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.hpp
# Opt level: O2

void __thiscall gamespace::Match::Match(Match *this,Match *other)

{
  pointer puVar1;
  pointer pcVar2;
  pointer pfVar3;
  pointer pfVar4;
  
  GameBoard::GameBoard(&this->_board,&other->_board);
  puVar1 = (other->_move).
           super__Vector_base<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>,_std::allocator<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->_move).
  super__Vector_base<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>,_std::allocator<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (other->_move).
       super__Vector_base<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>,_std::allocator<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->_move).
  super__Vector_base<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>,_std::allocator<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  (this->_move).
  super__Vector_base<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>,_std::allocator<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (other->_move).
       super__Vector_base<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>,_std::allocator<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (other->_move).
  super__Vector_base<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>,_std::allocator<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (other->_move).
  super__Vector_base<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>,_std::allocator<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (other->_move).
  super__Vector_base<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>,_std::allocator<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar2 = (other->_on_player_change).
           super__Vector_base<gamespace::Match::cb_player_t,_std::allocator<gamespace::Match::cb_player_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->_on_player_change).
  super__Vector_base<gamespace::Match::cb_player_t,_std::allocator<gamespace::Match::cb_player_t>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (other->_on_player_change).
       super__Vector_base<gamespace::Match::cb_player_t,_std::allocator<gamespace::Match::cb_player_t>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->_on_player_change).
  super__Vector_base<gamespace::Match::cb_player_t,_std::allocator<gamespace::Match::cb_player_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = pcVar2;
  (this->_on_player_change).
  super__Vector_base<gamespace::Match::cb_player_t,_std::allocator<gamespace::Match::cb_player_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (other->_on_player_change).
       super__Vector_base<gamespace::Match::cb_player_t,_std::allocator<gamespace::Match::cb_player_t>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (other->_on_player_change).
  super__Vector_base<gamespace::Match::cb_player_t,_std::allocator<gamespace::Match::cb_player_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (other->_on_player_change).
  super__Vector_base<gamespace::Match::cb_player_t,_std::allocator<gamespace::Match::cb_player_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (other->_on_player_change).
  super__Vector_base<gamespace::Match::cb_player_t,_std::allocator<gamespace::Match::cb_player_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pfVar3 = (other->_on_win).
           super__Vector_base<std::function<void_(gamespace::Player_&)>,_std::allocator<std::function<void_(gamespace::Player_&)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->_on_win).
  super__Vector_base<std::function<void_(gamespace::Player_&)>,_std::allocator<std::function<void_(gamespace::Player_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (other->_on_win).
       super__Vector_base<std::function<void_(gamespace::Player_&)>,_std::allocator<std::function<void_(gamespace::Player_&)>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->_on_win).
  super__Vector_base<std::function<void_(gamespace::Player_&)>,_std::allocator<std::function<void_(gamespace::Player_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pfVar3;
  (this->_on_win).
  super__Vector_base<std::function<void_(gamespace::Player_&)>,_std::allocator<std::function<void_(gamespace::Player_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (other->_on_win).
       super__Vector_base<std::function<void_(gamespace::Player_&)>,_std::allocator<std::function<void_(gamespace::Player_&)>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (other->_on_win).
  super__Vector_base<std::function<void_(gamespace::Player_&)>,_std::allocator<std::function<void_(gamespace::Player_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (other->_on_win).
  super__Vector_base<std::function<void_(gamespace::Player_&)>,_std::allocator<std::function<void_(gamespace::Player_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (other->_on_win).
  super__Vector_base<std::function<void_(gamespace::Player_&)>,_std::allocator<std::function<void_(gamespace::Player_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pfVar4 = (other->_on_move).
           super__Vector_base<std::function<void_(gamespace::Move_&)>,_std::allocator<std::function<void_(gamespace::Move_&)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->_on_move).
  super__Vector_base<std::function<void_(gamespace::Move_&)>,_std::allocator<std::function<void_(gamespace::Move_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (other->_on_move).
       super__Vector_base<std::function<void_(gamespace::Move_&)>,_std::allocator<std::function<void_(gamespace::Move_&)>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->_on_move).
  super__Vector_base<std::function<void_(gamespace::Move_&)>,_std::allocator<std::function<void_(gamespace::Move_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pfVar4;
  (this->_on_move).
  super__Vector_base<std::function<void_(gamespace::Move_&)>,_std::allocator<std::function<void_(gamespace::Move_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (other->_on_move).
       super__Vector_base<std::function<void_(gamespace::Move_&)>,_std::allocator<std::function<void_(gamespace::Move_&)>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (other->_on_move).
  super__Vector_base<std::function<void_(gamespace::Move_&)>,_std::allocator<std::function<void_(gamespace::Move_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (other->_on_move).
  super__Vector_base<std::function<void_(gamespace::Move_&)>,_std::allocator<std::function<void_(gamespace::Move_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (other->_on_move).
  super__Vector_base<std::function<void_(gamespace::Move_&)>,_std::allocator<std::function<void_(gamespace::Move_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Player::Player(&this->_player1,&other->_player1);
  Player::Player(&this->_player2,&other->_player2);
  this->_currentPlayer = &this->_player1;
  this->_turn = 0;
  this->_lid = other->_lid;
  other->_currentPlayer = (Player *)0x0;
  (this->_board)._match = this;
  return;
}

Assistant:

Match(Match &&other)
        : _board(std::move(other._board)), _move(std::move(other._move))
        , _on_player_change(std::move(other._on_player_change)), _on_win(std::move(other._on_win))
        , _on_move(std::move(other._on_move))
        , _player1(std::move(other._player1))
        , _player2(std::move(other._player2))
        , _currentPlayer(&_player1), _turn(0), _lid(other._lid) {
            other._currentPlayer = nullptr;
            _board.match() = this;
        }